

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImGuiTabBar *__src;
  ImGuiTabBar *__dest;
  int iVar4;
  
  iVar2 = this->FreeIdx;
  iVar4 = (this->Data).Size;
  if (iVar2 == iVar4) {
    iVar1 = iVar4 + 1;
    iVar3 = (this->Data).Capacity;
    if (iVar3 <= iVar4) {
      if (iVar3 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar3 / 2 + iVar3;
      }
      if (iVar4 <= iVar1) {
        iVar4 = iVar1;
      }
      if (iVar3 < iVar4) {
        __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar4 << 7);
        __src = (this->Data).Data;
        if (__src != (ImGuiTabBar *)0x0) {
          memcpy(__dest,__src,(long)(this->Data).Size << 7);
          ImGui::MemFree((this->Data).Data);
        }
        (this->Data).Data = __dest;
        (this->Data).Capacity = iVar4;
      }
    }
    (this->Data).Size = iVar1;
    iVar4 = this->FreeIdx + 1;
  }
  else {
    if (iVar4 <= iVar2) goto LAB_0018c657;
    iVar4 = (this->Data).Data[iVar2].Tabs.Size;
  }
  this->FreeIdx = iVar4;
  if (iVar2 < (this->Data).Size) {
    ImGuiTabBar::ImGuiTabBar((this->Data).Data + iVar2);
    if (iVar2 < (this->Data).Size) {
      return (this->Data).Data + iVar2;
    }
  }
LAB_0018c657:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4d8,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }